

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.c
# Opt level: O0

int vrna_hamming_distance(char *s1,char *s2)

{
  bool bVar1;
  int local_1c;
  char *pcStack_18;
  int h;
  char *s2_local;
  char *s1_local;
  
  local_1c = 0;
  pcStack_18 = s2;
  s2_local = s1;
  while( true ) {
    bVar1 = false;
    if (*s2_local != '\0') {
      bVar1 = *pcStack_18 != '\0';
    }
    if (!bVar1) break;
    if (*s2_local != *pcStack_18) {
      local_1c = local_1c + 1;
    }
    s2_local = s2_local + 1;
    pcStack_18 = pcStack_18 + 1;
  }
  return local_1c;
}

Assistant:

PUBLIC int
vrna_hamming_distance(const char  *s1,
                      const char  *s2)
{
  int h = 0;

  for (; *s1 && *s2; s1++, s2++)
    if (*s1 != *s2)
      h++;

  return h;
}